

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

void dmrC_show_entry(dmr_C *C,entrypoint *ep)

{
  char *pcVar1;
  undefined1 local_58 [8];
  ptr_list_iter bbiter__;
  ptr_list_iter symiter__;
  basic_block *bb;
  symbol *sym;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  pcVar1 = dmrC_show_ident(C,ep->name->ident);
  printf("%s:\n",pcVar1);
  if (C->verbose != 0) {
    pcVar1 = dmrC_show_ident(C,ep->name->ident);
    printf("ep %p: %s\n",ep,pcVar1);
    ptrlist_forward_iterator((ptr_list_iter *)&bbiter__.__nr,(ptr_list *)ep->syms);
    bb = (basic_block *)ptrlist_iter_next((ptr_list_iter *)&bbiter__.__nr);
    while (bb != (basic_block *)0x0) {
      if ((bb[2].children != (basic_block_list *)0x0) &&
         ((bb[2].children)->next_ != (basic_block_list *)0x0)) {
        pcVar1 = dmrC_show_ident(C,(ident *)bb->ep);
        printf("   sym: %p %s\n",bb,pcVar1);
        if ((bb[1].generation & 0x8000c) != 0) {
          printf("\texternal visibility\n");
        }
        show_symbol_usage(C,(pseudo_t)bb[2].children);
      }
      bb = (basic_block *)ptrlist_iter_next((ptr_list_iter *)&bbiter__.__nr);
    }
    printf("\n");
  }
  ptrlist_forward_iterator((ptr_list_iter *)local_58,(ptr_list *)ep->bbs);
  symiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_58);
  while (symiter__._16_8_ != 0) {
    if ((symiter__._16_8_ != 0) &&
       ((((*(long *)(symiter__._16_8_ + 0x20) != 0 || (*(long *)(symiter__._16_8_ + 0x28) != 0)) ||
         (*(long *)(symiter__._16_8_ + 0x30) != 0)) || (1 < C->verbose)))) {
      dmrC_show_bb(C,(basic_block *)symiter__._16_8_);
      printf("\n");
    }
    symiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_58);
  }
  printf("\n");
  return;
}

Assistant:

void dmrC_show_entry(struct dmr_C *C, struct entrypoint *ep)
{
	struct symbol *sym;
	struct basic_block *bb;

	printf("%s:\n", dmrC_show_ident(C, ep->name->ident));

	if (C->verbose) {
		printf("ep %p: %s\n", ep, dmrC_show_ident(C, ep->name->ident));

		FOR_EACH_PTR(ep->syms, sym) {
			if (!sym->pseudo)
				continue;
			if (!sym->pseudo->users)
				continue;
			printf("   sym: %p %s\n", sym, dmrC_show_ident(C, sym->ident));
			if (sym->ctype.modifiers & (MOD_EXTERN | MOD_STATIC | MOD_ADDRESSABLE))
				printf("\texternal visibility\n");
			show_symbol_usage(C, sym->pseudo);
		} END_FOR_EACH_PTR(sym);

		printf("\n");
	}

	FOR_EACH_PTR(ep->bbs, bb) {
		if (!bb)
			continue;
		if (!bb->parents && !bb->children && !bb->insns && C->verbose < 2)
			continue;
		dmrC_show_bb(C, bb);
		printf("\n");
	} END_FOR_EACH_PTR(bb);

	printf("\n");
}